

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O1

ImageFeatureType_ImageSize * __thiscall
CoreML::Specification::ImageFeatureType_ImageSize::New
          (ImageFeatureType_ImageSize *this,Arena *arena)

{
  ImageFeatureType_ImageSize *this_00;
  
  this_00 = (ImageFeatureType_ImageSize *)operator_new(0x28);
  ImageFeatureType_ImageSize(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::ImageFeatureType_ImageSize>(arena,this_00);
  }
  return this_00;
}

Assistant:

ImageFeatureType_ImageSize* ImageFeatureType_ImageSize::New(::google::protobuf::Arena* arena) const {
  ImageFeatureType_ImageSize* n = new ImageFeatureType_ImageSize;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}